

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall arma::Mat<double>::Mat<true>(Mat<double> *this,xtrans_mat<double,_true> *X)

{
  xtrans_mat<double,_true> *in_RSI;
  Mat<double> *in_RDI;
  Mat<double> *in_stack_00000020;
  
  in_RDI->n_rows = in_RSI->n_rows;
  in_RDI->n_cols = in_RSI->n_cols;
  in_RDI->n_elem = in_RSI->n_elem;
  in_RDI->n_alloc = 0;
  in_RDI->vec_state = 0;
  in_RDI->mem_state = 0;
  in_RDI->mem = (double *)0x0;
  init_cold(in_stack_00000020);
  xtrans_mat<double,_true>::extract(in_RSI,in_RDI);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const xtrans_mat<eT,do_conj>& X)
  : n_rows(X.n_rows)
  , n_cols(X.n_cols)
  , n_elem(X.n_elem)
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  
  X.extract(*this);
  }